

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error sdf_move_to(FT_26D6_Vec *to,void *user)

{
  FT_Pos FVar1;
  FT_Pos *pFVar2;
  FT_Error error;
  FT_Error local_1c;
  
  if (to != (FT_26D6_Vec *)0x0) {
    local_1c = 0;
    if (*user == (FT_Memory)0x0) {
      local_1c = 6;
    }
    else {
      pFVar2 = (FT_Pos *)ft_mem_qalloc(*user,0x20,&local_1c);
      if (local_1c == 0) {
        pFVar2[2] = 0;
        pFVar2[3] = 0;
        *pFVar2 = 0;
        pFVar2[1] = 0;
        FVar1 = to->y;
        *pFVar2 = to->x;
        pFVar2[1] = FVar1;
        pFVar2[3] = *(FT_Pos *)((long)user + 8);
        *(FT_Pos **)((long)user + 8) = pFVar2;
        local_1c = 0;
      }
    }
    return local_1c;
  }
  return 6;
}

Assistant:

static FT_Error
  sdf_move_to( const FT_26D6_Vec* to,
               void*              user )
  {
    SDF_Shape*    shape   = ( SDF_Shape* )user;
    SDF_Contour*  contour = NULL;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = shape->memory;


    if ( !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_CALL( sdf_contour_new( memory, &contour ) );

    contour->last_pos = *to;
    contour->next     = shape->contours;
    shape->contours   = contour;

  Exit:
    return error;
  }